

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

pair<int,_int> __thiscall imrt::Collimator::indexToPos(Collimator *this,int index,int angle)

{
  pointer pdVar1;
  mapped_type *pmVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  double y;
  double x;
  int local_44;
  double local_40;
  double local_38;
  
  local_44 = angle;
  pmVar2 = std::
           map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
           ::operator[](&this->angle_coord,&local_44);
  local_38 = (pmVar2->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start[index].first;
  pmVar2 = std::
           map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
           ::operator[](&this->angle_coord,&local_44);
  local_40 = (pmVar2->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start[index].second;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                    ((this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_38);
  pdVar1 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                    ((this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_40);
  return (pair<int,_int>)
         (((long)_Var4._M_current -
           (long)(this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start & 0xfffffffffffffff8U) << 0x1d |
         (ulong)((long)_Var3._M_current - (long)pdVar1) >> 3 & 0xffffffff);
}

Assistant:

pair<int,int> Collimator::indexToPos(int index, int angle){
    double x= angle_coord[angle][index].first;
    double y= angle_coord[angle][index].second;

    ptrdiff_t posx = find(xcoord.begin(), xcoord.end(), x) - xcoord.begin();
    ptrdiff_t posy = find(ycoord.begin(), ycoord.end(), y) - ycoord.begin();
    return(make_pair(posx, posy));
  }